

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

void __thiscall
booster::locale::details::format_parser::format_parser
          (format_parser *this,ios_base *ios,void *cookie,_func_void_void_ptr_locale_ptr *imbuer)

{
  uint uVar1;
  fmtflags fVar2;
  pointer pdVar3;
  streamsize sVar4;
  _func_void_void_ptr_locale_ptr *in_RCX;
  void *in_RDX;
  ios_base *in_RSI;
  undefined8 *in_RDI;
  pointer in_stack_ffffffffffffff88;
  data *in_stack_ffffffffffffff90;
  locale local_38 [3];
  _func_void_void_ptr_locale_ptr *local_20;
  void *local_18;
  ios_base *local_10;
  
  *in_RDI = in_RSI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  operator_new(0x88);
  data::data(in_stack_ffffffffffffff90);
  std::
  unique_ptr<booster::locale::details::format_parser::data,std::default_delete<booster::locale::details::format_parser::data>>
  ::unique_ptr<std::default_delete<booster::locale::details::format_parser::data>,void>
            ((unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
              *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  uVar1 = std::numeric_limits<unsigned_int>::max();
  pdVar3 = std::
           unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
           ::operator->((unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
                         *)0x231e05);
  pdVar3->position = uVar1;
  sVar4 = std::ios_base::precision(local_10);
  pdVar3 = std::
           unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
           ::operator->((unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
                         *)0x231e2a);
  pdVar3->precision = sVar4;
  fVar2 = std::ios_base::flags(local_10);
  pdVar3 = std::
           unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
           ::operator->((unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
                         *)0x231e51);
  pdVar3->flags = fVar2;
  ios_info::get((ios_base *)0x231e62);
  std::
  unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
  ::operator->((unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
                *)0x231e77);
  ios_info::operator=((ios_info *)in_stack_ffffffffffffff90,(ios_info *)in_stack_ffffffffffffff88);
  std::ios_base::getloc((ios_base *)in_stack_ffffffffffffff88);
  pdVar3 = std::
           unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
           ::operator->((unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
                         *)0x231ea9);
  std::locale::operator=(&pdVar3->saved_locale,local_38);
  std::locale::~locale(local_38);
  pdVar3 = std::
           unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
           ::operator->((unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
                         *)0x231ed2);
  pdVar3->restore_locale = false;
  pdVar3 = std::
           unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
           ::operator->((unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
                         *)0x231eed);
  pdVar3->cookie = local_18;
  pdVar3 = std::
           unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
           ::operator->((unique_ptr<booster::locale::details::format_parser::data,_std::default_delete<booster::locale::details::format_parser::data>_>
                         *)0x231f0d);
  pdVar3->imbuer = local_20;
  return;
}

Assistant:

format_parser::format_parser(std::ios_base &ios,void *cookie,void (*imbuer)(void *,std::locale const &)) : 
                ios_(ios),
                d(new data)
            {
                d->position=std::numeric_limits<unsigned>::max();
                d->precision=ios.precision();
                d->flags = ios.flags();
                d->info=ios_info::get(ios);
                d->saved_locale = ios.getloc();
                d->restore_locale=false;
                d->cookie = cookie;
                d->imbuer = imbuer;
            }